

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmimedata.cpp
# Opt level: O1

QStringList * __thiscall QMimeData::formats(QStringList *__return_storage_ptr__,QMimeData *this)

{
  QObjectData *pQVar1;
  QString *pQVar2;
  QMimeDataStruct *e;
  char16_t **args;
  
  pQVar1 = (this->super_QObject).d_ptr.d;
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (QString *)0x0;
  (__return_storage_ptr__->d).size = 0;
  QList<QString>::reserve
            (__return_storage_ptr__,
             (long)((int)((ulong)(*(long *)&pQVar1[1].field_0x30 - pQVar1[1].children.d.size) >> 3)
                   * -0x49249249));
  pQVar2 = *(QString **)&pQVar1[1].field_0x30;
  for (args = (char16_t **)pQVar1[1].children.d.size; (QString *)args != pQVar2; args = args + 7) {
    QtPrivate::QMovableArrayOps<QString>::emplace<QString_const&>
              ((QMovableArrayOps<QString> *)__return_storage_ptr__,(__return_storage_ptr__->d).size,
               (QString *)args);
    QList<QString>::end(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

QStringList QMimeData::formats() const
{
    Q_D(const QMimeData);
    QStringList list;
    list.reserve(static_cast<int>(d->dataList.size()));
    for (auto &e : d->dataList)
        list += e.format;
    return list;
}